

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imageadapter.h
# Opt level: O2

void __thiscall
bgui::ImageAdapter<float>::copyInto(ImageAdapter<float> *this,ImageU8 *rgb,long x,long y)

{
  mapping mVar1;
  uint uVar2;
  uint ig;
  bool bVar3;
  Image<float,_gimage::PixelTraits<float>_> *pIVar4;
  int k;
  long lVar5;
  long lVar6;
  ulong uVar7;
  float fVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  double dVar11;
  undefined1 auVar12 [16];
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double b;
  double g;
  double r;
  double local_c8;
  double local_c0;
  double local_b8;
  double local_b0;
  double local_a8;
  uint local_9c;
  double local_98;
  double local_90;
  double local_88;
  double local_80;
  double local_78;
  uint local_6c;
  double local_68;
  undefined8 uStack_60;
  double local_50;
  double local_48;
  double local_40;
  long local_38;
  
  local_50 = 1.0;
  local_90 = 1.0 / (this->super_ImageAdapterBase).scale;
  local_98 = (this->super_ImageAdapterBase).imax - (this->super_ImageAdapterBase).imin;
  pIVar4 = this->image;
  lVar5 = pIVar4->width;
  lVar6 = pIVar4->height;
  local_38 = y;
  if (0.0 < local_98) {
    dVar13 = log(local_98);
    dVar13 = floor(dVar13 / 2.302585092994046);
    local_50 = pow(10.0,dVar13 + -1.0);
    pIVar4 = this->image;
  }
  if (((this->super_ImageAdapterBase).rotation & 1) != 0) {
    lVar6 = pIVar4->width;
    lVar5 = pIVar4->height;
  }
  uVar2 = (uint)(2 < pIVar4->depth);
  local_9c = (this->super_ImageAdapterBase).channel;
  ig = local_9c;
  local_6c = local_9c;
  if ((int)local_9c < 0 || pIVar4->depth <= (int)local_9c) {
    local_9c = 0;
    ig = uVar2;
    local_6c = uVar2 * 2;
  }
  local_40 = (double)lVar6;
  local_48 = (double)x;
  local_80 = (double)lVar5;
  lVar5 = 0;
  dVar13 = local_90;
  do {
    if (rgb->height <= lVar5) {
      return;
    }
    local_b0 = (this->super_ImageAdapterBase).scale;
    local_78 = (double)(local_38 + lVar5) / local_b0;
    if (local_78 < 0.0) {
      uVar7 = 0;
    }
    else {
      uVar7 = 0;
      if (local_78 < local_40) {
        local_b0 = local_48 / local_b0;
        for (uVar7 = 0; (local_b0 < 0.0 && ((long)uVar7 < rgb->width)); uVar7 = uVar7 + 1) {
          (*rgb->img)[lVar5][uVar7] = '\0';
          rgb->img[1][lVar5][uVar7] = '\0';
          rgb->img[2][lVar5][uVar7] = '\0';
          local_b0 = local_b0 + dVar13;
        }
        if ((ig == local_9c) && (mVar1 = (this->super_ImageAdapterBase).map, mVar1 != map_raw)) {
          if (mVar1 == map_jet) {
            for (; (local_b0 < local_80 && ((long)uVar7 < rgb->width)); uVar7 = uVar7 + 1) {
              fVar8 = (float)((double)(this->super_ImageAdapterBase).R.v[0][2] +
                             (double)(this->super_ImageAdapterBase).R.v[0][0] * local_b0 +
                             (double)(this->super_ImageAdapterBase).R.v[0][1] * local_78);
              local_68 = (double)CONCAT44(local_68._4_4_,fVar8);
              dVar13 = (double)(this->super_ImageAdapterBase).R.v[1][2] +
                       (double)(this->super_ImageAdapterBase).R.v[1][0] * local_b0 +
                       (double)(this->super_ImageAdapterBase).R.v[1][1] * local_78;
              local_88 = getPixel(this,fVar8,(float)dVar13,ig);
              bVar3 = gimage::Image<float,_gimage::PixelTraits<float>_>::isValid
                                (this->image,(long)local_68._0_4_,(long)dVar13);
              if (bVar3) {
                dVar13 = (this->super_ImageAdapterBase).imin;
                dVar11 = -0.05;
                if ((dVar13 <= local_88) &&
                   (dVar11 = 1.05, local_88 <= (this->super_ImageAdapterBase).imax)) {
                  dVar11 = (local_88 - dVar13) / local_98;
                  dVar13 = (this->super_ImageAdapterBase).gamma;
                  if ((dVar13 != 1.0) || (NAN(dVar13))) {
                    if ((int)(dVar13 + 0.5) == 2) {
                      if (dVar11 < 0.0) {
                        dVar11 = sqrt(dVar11);
                      }
                      else {
                        dVar11 = SQRT(dVar11);
                      }
                    }
                    else if (2 < (int)(dVar13 + 0.5)) {
                      dVar11 = 0.0;
                    }
                  }
                }
                dVar13 = dVar11 / 1.15 + 0.1;
                auVar12._0_8_ = ABS(dVar13 + -0.75) * -4.0 + 1.5;
                auVar12._8_8_ = ABS(dVar13 + -0.5) * -4.0 + 1.5;
                auVar12 = minpd(auVar12,_DAT_0011c1b0);
                auVar12 = maxpd(auVar12,_DAT_0011c1d0);
                dVar13 = ABS(dVar13 + -0.25) * -4.0 + 1.5;
                if (1.0 <= dVar13) {
                  dVar13 = 1.0;
                }
                if (dVar13 <= 0.0) {
                  dVar13 = 0.0;
                }
              }
              else {
                auVar12 = ZEXT816(0);
                dVar13 = 0.0;
              }
              (*rgb->img)[lVar5][uVar7] = (uchar)(int)(auVar12._0_8_ * 255.0 + 0.5);
              rgb->img[1][lVar5][uVar7] = (uchar)(int)(auVar12._8_8_ * 255.0 + 0.5);
              rgb->img[2][lVar5][uVar7] = (uchar)(int)(dVar13 * 255.0 + 0.5);
              local_b0 = local_b0 + local_90;
              dVar13 = local_90;
            }
          }
          else if (mVar1 == map_rainbow) {
            for (; (local_b0 < local_80 && ((long)uVar7 < rgb->width)); uVar7 = uVar7 + 1) {
              fVar8 = (float)((double)(this->super_ImageAdapterBase).R.v[0][2] +
                             (double)(this->super_ImageAdapterBase).R.v[0][0] * local_b0 +
                             (double)(this->super_ImageAdapterBase).R.v[0][1] * local_78);
              local_68 = (double)CONCAT44(local_68._4_4_,fVar8);
              dVar13 = (double)(this->super_ImageAdapterBase).R.v[1][2] +
                       (double)(this->super_ImageAdapterBase).R.v[1][0] * local_b0 +
                       (double)(this->super_ImageAdapterBase).R.v[1][1] * local_78;
              local_88 = getPixel(this,fVar8,(float)dVar13,ig);
              bVar3 = gimage::Image<float,_gimage::PixelTraits<float>_>::isValid
                                (this->image,(long)local_68._0_4_,(long)dVar13);
              dVar11 = 0.0;
              dVar13 = 0.0;
              dVar16 = 0.0;
              if (bVar3) {
                local_b8 = (this->super_ImageAdapterBase).imin;
                uVar9 = SUB84(local_b8,0);
                uVar10 = (undefined4)((ulong)local_b8 >> 0x20);
                dVar16 = (this->super_ImageAdapterBase).imax;
                if (local_b8 <= local_88) {
                  uVar9 = SUB84(local_88,0);
                  uVar10 = (undefined4)((ulong)local_88 >> 0x20);
                }
                if ((double)CONCAT44(uVar10,uVar9) <= dVar16) {
                  dVar16 = (double)CONCAT44(uVar10,uVar9);
                }
                local_68 = dVar16 / local_50;
                uStack_60 = 0;
                dVar13 = floor(local_68);
                dVar13 = (local_68 - dVar13) * 6.0;
                dVar15 = dVar13 - (double)(int)dVar13;
                dVar14 = 0.0;
                switch((int)dVar13) {
                case 0:
                  dVar11 = 1.0;
                  dVar13 = dVar15;
                  break;
                case 1:
                  dVar11 = 1.0 - dVar15;
                  dVar13 = 1.0;
                  break;
                case 2:
                  dVar11 = 0.0;
                  dVar14 = dVar15;
                  dVar13 = 1.0;
                  break;
                case 3:
                  dVar11 = 0.0;
                  dVar14 = 1.0;
                  dVar13 = 1.0 - dVar15;
                  break;
                case 4:
                  dVar14 = 1.0;
                  dVar13 = 0.0;
                  dVar11 = dVar15;
                  break;
                default:
                  dVar14 = 1.0 - dVar15;
                  dVar13 = 0.0;
                  dVar11 = 1.0;
                }
                dVar16 = ((dVar16 - local_b8) * 1.6) / local_98 + -0.8;
                if (0.0 <= dVar16) {
                  dVar15 = 1.0 - dVar16;
                  dVar11 = dVar11 * dVar15 + dVar16;
                  dVar13 = dVar13 * dVar15 + dVar16;
                  dVar16 = dVar16 + dVar15 * dVar14;
                }
                else {
                  dVar16 = dVar16 + 1.0;
                  dVar11 = dVar11 * dVar16;
                  dVar13 = dVar13 * dVar16;
                  dVar16 = dVar16 * dVar14;
                }
              }
              (*rgb->img)[lVar5][uVar7] = (uchar)(int)(dVar11 * 255.0 + 0.5);
              rgb->img[1][lVar5][uVar7] = (uchar)(int)(dVar13 * 255.0 + 0.5);
              rgb->img[2][lVar5][uVar7] = (uchar)(int)(dVar16 * 255.0 + 0.5);
              local_b0 = local_b0 + local_90;
              dVar13 = local_90;
            }
          }
        }
        else {
          for (; (local_b0 < local_80 && ((long)uVar7 < rgb->width)); uVar7 = uVar7 + 1) {
            getPixel(this,&local_a8,&local_c0,&local_c8,
                     (float)((double)(this->super_ImageAdapterBase).R.v[0][2] +
                            (double)(this->super_ImageAdapterBase).R.v[0][0] * local_b0 +
                            (double)(this->super_ImageAdapterBase).R.v[0][1] * local_78),
                     (float)((double)(this->super_ImageAdapterBase).R.v[1][2] +
                            (double)(this->super_ImageAdapterBase).R.v[1][0] * local_b0 +
                            (double)(this->super_ImageAdapterBase).R.v[1][1] * local_78),local_9c,ig
                     ,local_6c);
            uVar9 = SUB84(local_a8,0);
            uVar10 = (undefined4)((ulong)local_a8 >> 0x20);
            dVar13 = (this->super_ImageAdapterBase).imin;
            dVar11 = (this->super_ImageAdapterBase).imax;
            if (dVar11 <= local_a8) {
              uVar9 = SUB84(dVar11,0);
              uVar10 = (undefined4)((ulong)dVar11 >> 0x20);
            }
            if ((double)CONCAT44(uVar10,uVar9) <= dVar13) {
              uVar9 = SUB84(dVar13,0);
              uVar10 = (undefined4)((ulong)dVar13 >> 0x20);
            }
            local_a8 = ((double)CONCAT44(uVar10,uVar9) - dVar13) / local_98;
            if (dVar11 <= local_c0) {
              local_c0 = dVar11;
            }
            if (local_c0 <= dVar13) {
              local_c0 = dVar13;
            }
            local_c0 = (local_c0 - dVar13) / local_98;
            if (dVar11 <= local_c8) {
              local_c8 = dVar11;
            }
            if (local_c8 <= dVar13) {
              local_c8 = dVar13;
            }
            local_c8 = (local_c8 - dVar13) / local_98;
            dVar13 = (this->super_ImageAdapterBase).gamma;
            if ((dVar13 != 1.0) || (NAN(dVar13))) {
              if ((int)(dVar13 + 0.5) == 2) {
                if (local_a8 < 0.0) {
                  local_a8 = sqrt(local_a8);
                }
                else {
                  local_a8 = SQRT(local_a8);
                }
                if (local_c0 < 0.0) {
                  local_c0 = sqrt(local_c0);
                  dVar13 = local_c8;
                }
                else {
                  local_c0 = SQRT(local_c0);
                  dVar13 = local_c8;
                }
              }
              else {
                if ((int)(dVar13 + 0.5) < 3) goto LAB_00114f77;
                if (local_a8 < 0.0) {
                  dVar13 = sqrt(local_a8);
                }
                else {
                  dVar13 = SQRT(local_a8);
                }
                if (dVar13 < 0.0) {
                  local_a8 = sqrt(dVar13);
                }
                else {
                  local_a8 = SQRT(dVar13);
                }
                if (local_c0 < 0.0) {
                  dVar13 = sqrt(local_c0);
                }
                else {
                  dVar13 = SQRT(local_c0);
                }
                if (dVar13 < 0.0) {
                  local_c0 = sqrt(dVar13);
                }
                else {
                  local_c0 = SQRT(dVar13);
                }
                if (local_c8 < 0.0) {
                  dVar13 = sqrt(local_c8);
                }
                else {
                  dVar13 = SQRT(local_c8);
                }
              }
              if (dVar13 < 0.0) {
                local_c8 = sqrt(dVar13);
              }
              else {
                local_c8 = SQRT(dVar13);
              }
            }
LAB_00114f77:
            (*rgb->img)[lVar5][uVar7] = (uchar)(int)(local_a8 * 255.0 + 0.5);
            rgb->img[1][lVar5][uVar7] = (uchar)(int)(local_c0 * 255.0 + 0.5);
            rgb->img[2][lVar5][uVar7] = (uchar)(int)(local_c8 * 255.0 + 0.5);
            local_b0 = local_b0 + local_90;
            dVar13 = local_90;
          }
        }
      }
    }
    for (uVar7 = uVar7 & 0xffffffff; (long)uVar7 < rgb->width; uVar7 = uVar7 + 1) {
      (*rgb->img)[lVar5][uVar7] = '\0';
      rgb->img[1][lVar5][uVar7] = '\0';
      rgb->img[2][lVar5][uVar7] = '\0';
    }
    lVar5 = lVar5 + 1;
  } while( true );
}

Assistant:

void copyInto(gimage::ImageU8 &rgb, long x, long y) const
    {
      const double step=1/scale;
      const double irange=imax-imin;
      int ir=0, ig=1, ib=2;
      long iw=image->getWidth();
      long ih=image->getHeight();
      double rainbow_size=1;

      if (irange > 0)
      {
        rainbow_size=std::pow(10, std::floor(std::log(irange)/std::log(10))-1);
      }

      if ((rotation&1) != 0)
      {
        iw=image->getHeight();
        ih=image->getWidth();
      }

      assert(rgb.getDepth() == 3);

      if (image->getDepth() < 3)
      {
        ir=ig=ib=0;
      }

      if (channel >= 0 && channel < image->getDepth())
      {
        ir=ig=ib=channel;
      }

      for (int k=0; k<rgb.getHeight(); k++)
      {
        double yf=(y+k)/scale;

        int i=0;

        if (yf >= 0 && yf < ih)
        {
          double xf=x/scale;

          while (xf < 0 && i < rgb.getWidth())
          {
            rgb.set(i, k, 0, 0);
            rgb.set(i, k, 1, 0);
            rgb.set(i, k, 2, 0);

            xf+=step;
            i++;
          }

          if (ig != ir || map == map_raw)
          {
            // map color image or greyscale image directly

            while (xf < iw && i < rgb.getWidth())
            {
              float xs=static_cast<float>(R(0, 0)*xf+R(0, 1)*yf+R(0, 2));
              float ys=static_cast<float>(R(1, 0)*xf+R(1, 1)*yf+R(1, 2));

              double r, g, b;
              getPixel(r, g, b, xs, ys, ir, ig, ib);

              r=(std::max(imin, std::min(imax, r))-imin)/irange;
              g=(std::max(imin, std::min(imax, g))-imin)/irange;
              b=(std::max(imin, std::min(imax, b))-imin)/irange;

              if (gamma != 1.0)
              {
                // pow() can be extremly slow and linear lookup tables would be
                // very big for data with higher radiometric depth, thats why we
                // only allow a gamma with root of 2 and 4.

                if (static_cast<int>(gamma+0.5) == 2)
                {
                  r=sqrt(r);
                  g=sqrt(g);
                  b=sqrt(b);
                }
                else if (static_cast<int>(gamma+0.5) >= 3)
                {
                  r=sqrt(sqrt(r));
                  g=sqrt(sqrt(g));
                  b=sqrt(sqrt(b));
                }
              }

              rgb.set(i, k, 0, static_cast<char>(255*r+0.5));
              rgb.set(i, k, 1, static_cast<char>(255*g+0.5));
              rgb.set(i, k, 2, static_cast<char>(255*b+0.5));

              xf+=step;
              i++;
            }
          }
          else if (map == map_jet)
          {
            // map greyscale image using jet encoding

            while (xf < iw && i < rgb.getWidth())
            {
              float xs=static_cast<float>(R(0, 0)*xf+R(0, 1)*yf+R(0, 2));
              float ys=static_cast<float>(R(1, 0)*xf+R(1, 1)*yf+R(1, 2));

              double v=getPixel(xs, ys, ir);
              double r=0.0;
              double g=0.0;
              double b=0.0;

              if (image->isValid(static_cast<long>(xs), static_cast<long>(ys)))
              {
                if (v >= imin)
                {
                  if (v <= imax)
                  {
                    v=(v-imin)/irange;

                    if (gamma != 1.0)
                    {
                      // pow() can be extremly slow and linear lookup tables would be
                      // very big for data with higher radiometric depth, thats why we
                      // only allow a gamma with root of 2 and 4.

                      if (static_cast<int>(gamma+0.5) == 2)
                      {
                        v=sqrt(v);
                      }
                      else if (static_cast<int>(gamma+0.5) >= 3)
                      {
                        v=sqrt(sqrt(r));
                      }
                    }
                  }
                  else
                  {
                    v=1.05;
                  }
                }
                else
                {
                  v=-0.05;
                }

                v=v/1.15+0.1;
                r=std::max(0.0, std::min(1.0, (1.5 - 4*fabs(v-0.75))));
                g=std::max(0.0, std::min(1.0, (1.5 - 4*fabs(v-0.5))));
                b=std::max(0.0, std::min(1.0, (1.5 - 4*fabs(v-0.25))));
              }

              rgb.set(i, k, 0, static_cast<char>(255*r+0.5));
              rgb.set(i, k, 1, static_cast<char>(255*g+0.5));
              rgb.set(i, k, 2, static_cast<char>(255*b+0.5));

              xf+=step;
              i++;
            }
          }
          else if (map == map_rainbow)
          {
            while (xf < iw && i < rgb.getWidth())
            {
              float xs=static_cast<float>(R(0, 0)*xf+R(0, 1)*yf+R(0, 2));
              float ys=static_cast<float>(R(1, 0)*xf+R(1, 1)*yf+R(1, 2));

              double v=getPixel(xs, ys, ir);
              double r=0.0;
              double g=0.0;
              double b=0.0;

              if (image->isValid(static_cast<long>(xs), static_cast<long>(ys)))
              {
                if (v < imin)
                {
                  v=imin;
                }

                if (v > imax)
                {
                  v=imax;
                }

                // compute color

                double v1=v/rainbow_size;

                v1=6.0*(v1-floor(v1));

                int v0=static_cast<int>(v1);

                v1-=v0;

                switch (v0)
                {
                  case 0:
                    r=1.0;
                    g=v1;
                    break;

                  case 1:
                    r=1.0-v1;
                    g=1.0;
                    break;

                  case 2:
                    g=1.0;
                    b=v1;
                    break;

                  case 3:
                    g=1.0-v1;
                    b=1.0;
                    break;

                  case 4:
                    b=1.0;
                    r=v1;
                    break;

                  default:
                    b=1.0-v1;
                    r=1.0;
                    break;
                }

                // compute brightness

                v=1.6*(v-imin)/irange-0.8;

                if (v < 0)
                {
                  r*=v+1;
                  g*=v+1;
                  b*=v+1;
                }
                else
                {
                  r=(1-v)*r+v;
                  g=(1-v)*g+v;
                  b=(1-v)*b+v;
                }
              }

              rgb.set(i, k, 0, static_cast<int>(255*r+0.5));
              rgb.set(i, k, 1, static_cast<int>(255*g+0.5));
              rgb.set(i, k, 2, static_cast<int>(255*b+0.5));

              xf+=step;
              i++;
            }
          }
        }

        while (i < rgb.getWidth())
        {
          rgb.set(i, k, 0, 0);
          rgb.set(i, k, 1, 0);
          rgb.set(i, k, 2, 0);

          i++;
        }
      }
    }